

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,4ul>>(Attribute *this,array<double,_4UL> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type *pvVar4;
  optional<std::array<double,_4UL>_> ret;
  optional<std::array<double,_4UL>_> local_68;
  optional<std::array<double,_4UL>_> local_40;
  
  if (v == (array<double,_4UL> *)0x0) {
    local_68.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<double,4ul>>(&local_68,&this->_var);
    local_40.has_value_ = local_68.has_value_;
    if (local_68.has_value_ != false) {
      local_40.contained._16_8_ = local_68.contained._16_8_;
      local_40.contained._24_8_ = local_68.contained._24_8_;
      local_40.contained.data.__align = local_68.contained.data.__align;
      local_40.contained._8_8_ = local_68.contained._8_8_;
      pvVar4 = nonstd::optional_lite::optional<std::array<double,_4UL>_>::value(&local_40);
      dVar1 = pvVar4->_M_elems[1];
      dVar2 = pvVar4->_M_elems[2];
      dVar3 = pvVar4->_M_elems[3];
      v->_M_elems[0] = pvVar4->_M_elems[0];
      v->_M_elems[1] = dVar1;
      v->_M_elems[2] = dVar2;
      v->_M_elems[3] = dVar3;
    }
  }
  return local_68.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }